

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void InitializeInverseComplexFFT(int fft_size,InverseComplexFFT *inverse_complex_fft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  fft_complex *padVar4;
  fft_plan local_60;
  InverseComplexFFT *local_18;
  InverseComplexFFT *inverse_complex_fft_local;
  int fft_size_local;
  
  inverse_complex_fft->fft_size = fft_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)fft_size;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_18 = inverse_complex_fft;
  inverse_complex_fft_local._4_4_ = fft_size;
  padVar4 = (fft_complex *)operator_new__(uVar3);
  local_18->input = padVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)inverse_complex_fft_local._4_4_;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  padVar4 = (fft_complex *)operator_new__(uVar3);
  local_18->output = padVar4;
  fft_plan_dft_1d(&local_60,inverse_complex_fft_local._4_4_,local_18->input,local_18->output,2,3);
  memcpy(&local_18->inverse_fft,&local_60,0x48);
  return;
}

Assistant:

void InitializeInverseComplexFFT(int fft_size,
    InverseComplexFFT *inverse_complex_fft) {
  inverse_complex_fft->fft_size = fft_size;
  inverse_complex_fft->input = new fft_complex[fft_size];
  inverse_complex_fft->output = new fft_complex[fft_size];
  inverse_complex_fft->inverse_fft = fft_plan_dft_1d(fft_size,
    inverse_complex_fft->input, inverse_complex_fft->output,
    FFT_BACKWARD, FFT_ESTIMATE);
}